

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O1

void * alsa_run_thread(void *context)

{
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  snd_pcm_uframes_t *psVar1;
  __suseconds_t *p_Var2;
  float fVar3;
  long lVar4;
  cubeb_stream_conflict1 *pcVar5;
  cubeb_stream_conflict1 *pcVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  snd_pcm_state_t sVar12;
  long lVar13;
  undefined4 *puVar14;
  ulong uVar15;
  snd_pcm_uframes_t sVar16;
  snd_pcm_uframes_t sVar17;
  ssize_t sVar18;
  float *b;
  snd_pcm_uframes_t sVar19;
  uint uVar20;
  nfds_t nVar21;
  cubeb_stream_conflict1 *pcVar22;
  cubeb_state cVar23;
  snd_pcm_uframes_t sVar24;
  ulong uVar25;
  stream_state state;
  size_t sVar26;
  long lVar27;
  char dummy;
  unsigned_short revents;
  char *local_58;
  char *local_50;
  undefined1 local_33;
  unsigned_short local_32;
  
  __mutex = (pthread_mutex_t *)((long)context + 0x18);
  do {
    pthread_mutex_lock(__mutex);
    if (*(int *)((long)context + 0xd0) != 0) {
      sVar26 = 1;
      lVar13 = 0;
      do {
        lVar27 = *(long *)((long)context + lVar13 * 8 + 0x40);
        if ((lVar27 != 0) && (*(undefined8 *)(lVar27 + 0xc0) = 0, *(int *)(lVar27 + 0xb0) == 1)) {
          sVar26 = sVar26 + *(long *)(lVar27 + 200);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      free(*(void **)((long)context + 0xc0));
      puVar14 = (undefined4 *)calloc(sVar26,8);
      *(undefined4 **)((long)context + 0xc0) = puVar14;
      if (puVar14 == (undefined4 *)0x0) {
        __assert_fail("ctx->fds",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                      ,0xff,"void rebuild(cubeb *)");
      }
      *(size_t *)((long)context + 200) = sVar26;
      *puVar14 = *(undefined4 *)((long)context + 0xd8);
      *(undefined2 *)(puVar14 + 1) = 9;
      lVar13 = 1;
      lVar27 = 0;
      do {
        lVar4 = *(long *)((long)context + lVar27 * 8 + 0x40);
        if ((lVar4 != 0) && (*(int *)(lVar4 + 0xb0) == 1)) {
          memcpy((void *)(*(long *)((long)context + 0xc0) + lVar13 * 8),*(void **)(lVar4 + 0xb8),
                 *(long *)(lVar4 + 200) << 3);
          *(long *)(lVar4 + 0xc0) = lVar13 * 8 + *(long *)((long)context + 0xc0);
          lVar13 = lVar13 + *(long *)(lVar4 + 200);
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x10);
      *(undefined4 *)((long)context + 0xd0) = 0;
    }
    iVar11 = 1000;
    lVar13 = 0;
    do {
      lVar27 = *(long *)((long)context + lVar13 * 8 + 0x40);
      if ((lVar27 != 0) && (*(int *)(lVar27 + 0xb0) == 2)) {
        iVar10 = timeval_to_relative_ms((timeval *)(lVar27 + 0xd0));
        iVar9 = iVar10;
        if (iVar11 < iVar10) {
          iVar9 = iVar11;
        }
        if (-1 < iVar10) {
          iVar11 = iVar9;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    pthread_mutex_unlock(__mutex);
    iVar11 = poll(*(pollfd **)((long)context + 0xc0),*(nfds_t *)((long)context + 200),iVar11);
    pthread_mutex_lock(__mutex);
    if (iVar11 < 1) {
      if (iVar11 == 0) {
        lVar13 = 0;
        do {
          pcVar5 = *(cubeb_stream_conflict1 **)((long)context + lVar13 * 8 + 0x40);
          if (pcVar5 != (cubeb_stream_conflict1 *)0x0) {
            if ((pcVar5->state == DRAINING) &&
               (iVar11 = timeval_to_relative_ms(&pcVar5->drain_timeout), iVar11 < 1)) {
              cVar23 = CUBEB_STATE_DRAINED;
              state = INACTIVE;
            }
            else {
              if ((pcVar5->state != RUNNING) ||
                 (iVar11 = timeval_to_relative_ms(&pcVar5->last_activity), -0x2711 < iVar11))
              goto LAB_00118fd3;
              cVar23 = CUBEB_STATE_ERROR;
              state = ERROR;
            }
            alsa_set_stream_state(pcVar5,state);
            (*pcVar5->state_callback)(pcVar5,pcVar5->user_ptr,cVar23);
          }
LAB_00118fd3:
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
      }
    }
    else {
      if (((*(byte *)(*(long *)((long)context + 0xc0) + 6) & 1) != 0) &&
         (read(*(int *)((long)context + 0xd8),&local_33,1), *(int *)((long)context + 0xd4) != 0)) {
        pthread_mutex_unlock(__mutex);
        return (void *)0x0;
      }
      lVar13 = 0;
      do {
        pcVar5 = *(cubeb_stream_conflict1 **)((long)context + lVar13 * 8 + 0x40);
        if ((((pcVar5 != (cubeb_stream_conflict1 *)0x0) && (pcVar5->state == RUNNING)) &&
            (pcVar5->fds != (pollfd *)0x0)) && (pcVar5->nfds != 0)) {
          nVar21 = 0;
LAB_001189a5:
          if (pcVar5->fds[nVar21].revents == 0) goto code_r0x001189ad;
          alsa_set_stream_state(pcVar5,PROCESSING);
          pthread_mutex_unlock(__mutex);
          __mutex_00 = &pcVar5->mutex;
          pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
          (*cubeb_snd_pcm_poll_descriptors_revents)
                    (pcVar5->pcm,pcVar5->fds,(uint)pcVar5->nfds,&local_32);
          uVar15 = (*cubeb_snd_pcm_avail_update)(pcVar5->pcm);
          if (uVar15 == 0) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
            local_58._0_4_ = RUNNING;
          }
          else {
            uVar25 = pcVar5->buffer_size;
            if (uVar25 < (uVar15 & 0xffffffff)) {
              uVar15 = uVar25;
            }
            sVar16 = uVar15;
            if ((pcVar5->stream_type == SND_PCM_STREAM_CAPTURE) && (0 < (long)uVar15)) {
              if (uVar25 < pcVar5->bufframes + uVar15) {
                pcVar5->bufframes = 0;
              }
              sVar16 = (*cubeb_snd_pcm_readi)(pcVar5->pcm,pcVar5->buffer + pcVar5->bufframes,uVar15)
              ;
              if (-1 < (long)sVar16) {
                pcVar5->bufframes = pcVar5->bufframes + sVar16;
                pcVar5->stream_position = pcVar5->stream_position + sVar16;
                gettimeofday((timeval *)&pcVar5->last_activity,(__timezone_ptr_t)0x0);
                sVar16 = uVar15;
              }
            }
            sVar19 = sVar16;
            if (((pcVar5->stream_type == SND_PCM_STREAM_CAPTURE) &&
                (sVar17 = pcVar5->bufframes, sVar17 != 0)) &&
               ((pcVar6 = pcVar5->other_stream, pcVar22 = pcVar5,
                pcVar6 == (cubeb_stream_conflict1 *)0x0 ||
                (pcVar22 = pcVar6, pcVar6->bufframes < pcVar6->buffer_size)))) {
              if (pcVar6 == (cubeb_stream_conflict1 *)0x0) {
                local_50 = (char *)0x0;
              }
              else {
                local_50 = pcVar6->buffer + pcVar6->bufframes;
                sVar19 = pcVar6->buffer_size - pcVar6->bufframes;
                if ((long)sVar19 <= (long)sVar17) {
                  sVar17 = sVar19;
                }
              }
              pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
              sVar17 = (*pcVar5->data_callback)
                                 (pcVar22,pcVar5->user_ptr,pcVar5->buffer,local_50,sVar17);
              pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
              sVar19 = sVar17;
              if (-1 < (long)sVar17) {
                pcVar7 = pcVar5->buffer;
                sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar17);
                pcVar8 = pcVar5->buffer;
                sVar26 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,pcVar5->bufframes - sVar17);
                memmove(pcVar8,pcVar7 + sVar18,sVar26);
                pcVar5->bufframes = pcVar5->bufframes - sVar17;
                sVar19 = sVar16;
                if (pcVar5->other_stream != (cubeb_stream_conflict1 *)0x0) {
                  psVar1 = &pcVar5->other_stream->bufframes;
                  *psVar1 = *psVar1 + sVar17;
                }
              }
            }
            sVar16 = sVar19;
            if (pcVar5->stream_type == SND_PCM_STREAM_PLAYBACK) {
              sVar17 = pcVar5->bufframes;
              sVar24 = sVar19 - sVar17;
              if ((sVar24 != 0 && (long)sVar17 <= (long)sVar19) &&
                 ((pcVar6 = pcVar5->other_stream, pcVar6 == (cubeb_stream_conflict1 *)0x0 ||
                  (pcVar6->bufframes != 0)))) {
                if (pcVar6 == (cubeb_stream_conflict1 *)0x0) {
                  local_58 = (char *)0x0;
                }
                else {
                  local_58 = pcVar6->buffer;
                }
                pcVar7 = pcVar5->buffer;
                sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar17);
                if ((pcVar5->other_stream != (cubeb_stream_conflict1 *)0x0) &&
                   (sVar16 = pcVar5->other_stream->bufframes, (long)sVar16 <= (long)sVar24)) {
                  sVar24 = sVar16;
                }
                pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
                sVar17 = (*pcVar5->data_callback)
                                   (pcVar5,pcVar5->user_ptr,local_58,pcVar7 + sVar18,sVar24);
                pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
                sVar16 = sVar17;
                if (-1 < (long)sVar17) {
                  pcVar5->bufframes = pcVar5->bufframes + sVar17;
                  pcVar6 = pcVar5->other_stream;
                  sVar16 = sVar19;
                  if (pcVar6 != (cubeb_stream_conflict1 *)0x0) {
                    pcVar7 = pcVar6->buffer;
                    sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar6->pcm,sVar17);
                    pcVar8 = pcVar6->buffer;
                    sVar26 = (*cubeb_snd_pcm_frames_to_bytes)
                                       (pcVar6->pcm,pcVar6->bufframes - sVar17);
                    memmove(pcVar8,pcVar7 + sVar18,sVar26);
                    pcVar6->bufframes = pcVar6->bufframes - sVar17;
                  }
                }
              }
            }
            local_58._0_4_ = RUNNING;
            if (pcVar5->stream_type == SND_PCM_STREAM_PLAYBACK) {
              sVar19 = pcVar5->bufframes;
              lVar27 = sVar16 - sVar19;
              if (lVar27 != 0 && (long)sVar19 <= (long)sVar16) {
                uVar20 = (pcVar5->params).rate;
                pcVar7 = pcVar5->buffer;
                sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar19);
                sVar26 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,lVar27);
                memset(pcVar7 + sVar18,0,sVar26);
                pcVar5->bufframes = sVar16;
                if ((pcVar5->other_stream == (cubeb_stream_conflict1 *)0x0) ||
                   (pcVar5->other_stream->bufframes != 0)) {
                  uVar25 = (ulong)(((double)lVar27 / (double)uVar20) * 1000.0);
                  gettimeofday((timeval *)&pcVar5->drain_timeout,(__timezone_ptr_t)0x0);
                  uVar15 = uVar25 & 0xffffffff;
                  (pcVar5->drain_timeout).tv_sec = (pcVar5->drain_timeout).tv_sec + uVar15 / 1000;
                  p_Var2 = &(pcVar5->drain_timeout).tv_usec;
                  *p_Var2 = *p_Var2 + (ulong)(uint)(((int)uVar25 + (int)(uVar15 / 1000) * -1000) *
                                                   1000);
                  local_58._0_4_ = DRAINING;
                }
              }
            }
            sVar19 = sVar16;
            if ((pcVar5->stream_type == SND_PCM_STREAM_PLAYBACK) && (0 < (long)sVar16)) {
              lVar27 = (pcVar5->params).channels * sVar16;
              pcVar7 = pcVar5->buffer;
              if ((pcVar5->params).format == CUBEB_SAMPLE_FLOAT32LE) {
                if (0 < lVar27) {
                  uVar20 = 1;
                  uVar15 = 0;
                  do {
                    *(float *)(pcVar7 + uVar15 * 4) =
                         pcVar5->volume * *(float *)(pcVar7 + uVar15 * 4);
                    uVar15 = (ulong)uVar20;
                    uVar20 = uVar20 + 1;
                  } while (lVar27 - uVar15 != 0 && (long)uVar15 <= lVar27);
                }
              }
              else if (0 < lVar27) {
                fVar3 = pcVar5->volume;
                uVar20 = 1;
                uVar15 = 0;
                do {
                  *(short *)(pcVar7 + uVar15 * 2) =
                       (short)(int)((float)(int)*(short *)(pcVar7 + uVar15 * 2) * fVar3);
                  uVar15 = (ulong)uVar20;
                  uVar20 = uVar20 + 1;
                } while (lVar27 - uVar15 != 0 && (long)uVar15 <= lVar27);
              }
              sVar19 = (*cubeb_snd_pcm_writei)(pcVar5->pcm,pcVar5->buffer,sVar16);
              if (-1 < (long)sVar19) {
                pcVar7 = pcVar5->buffer;
                sVar18 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,sVar19);
                pcVar8 = pcVar5->buffer;
                sVar26 = (*cubeb_snd_pcm_frames_to_bytes)(pcVar5->pcm,pcVar5->bufframes - sVar19);
                memmove(pcVar8,pcVar7 + sVar18,sVar26);
                pcVar5->bufframes = pcVar5->bufframes - sVar19;
                pcVar5->stream_position = pcVar5->stream_position + sVar19;
                gettimeofday((timeval *)&pcVar5->last_activity,(__timezone_ptr_t)0x0);
                sVar19 = sVar16;
              }
            }
            if ((long)sVar19 < 0) {
              iVar11 = (*cubeb_snd_pcm_recover)(pcVar5->pcm,(int)sVar19,0);
              sVar19 = (snd_pcm_uframes_t)iVar11;
              if (((-1 < iVar11) && (pcVar5->stream_type == SND_PCM_STREAM_CAPTURE)) &&
                 (sVar12 = (*cubeb_snd_pcm_state)(pcVar5->pcm), sVar12 == SND_PCM_STATE_PREPARED)) {
                iVar11 = (*cubeb_snd_pcm_start)(pcVar5->pcm);
                sVar19 = (snd_pcm_uframes_t)iVar11;
              }
            }
            pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
            if ((long)sVar19 < 0) {
              (*pcVar5->state_callback)(pcVar5,pcVar5->user_ptr,CUBEB_STATE_ERROR);
              local_58._0_4_ = ERROR;
            }
          }
          pthread_mutex_lock(__mutex);
          alsa_set_stream_state(pcVar5,(stream_state)local_58);
        }
LAB_00118f56:
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
    pthread_mutex_unlock(__mutex);
  } while( true );
code_r0x001189ad:
  nVar21 = nVar21 + 1;
  if (pcVar5->nfds == nVar21) goto LAB_00118f56;
  goto LAB_001189a5;
}

Assistant:

static void *
alsa_run_thread(void * context)
{
  cubeb * ctx = context;
  int r;

  do {
    r = alsa_run(ctx);
  } while (r >= 0);

  return NULL;
}